

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GetTextureSubImage::Functional::prepare(Functional *this,GLenum target,bool is_compressed)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  char *msg;
  undefined8 in_stack_ffffffffffffffb8;
  uint uVar5;
  long lVar3;
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_texture);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                  ,0x354);
  (**(code **)(lVar3 + 0xb8))(target,this->m_texture);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                  ,0x357);
  if ((int)CONCAT71(in_register_00000011,is_compressed) != 0) {
    if (target == 0x9009) {
      (**(code **)(lVar3 + 0x290))
                (0x9009,0,0x9274,8,8,6,(ulong)uVar5 << 0x20,0xc0,s_texture_data_compressed);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      msg = "glCompressedTexImage3D call failed.";
      iVar1 = 899;
    }
    else if (target == 0x8513) {
      (**(code **)(lVar3 + 0x288))(0x8515,0,0x9274,8,8,0,0x20,s_texture_data_compressed);
      (**(code **)(lVar3 + 0x288))(0x8516,0,0x9274,8,8,0,0x20,s_texture_data_compressed + 0x20);
      (**(code **)(lVar3 + 0x288))(0x8517,0,0x9274,8,8,0,0x20,s_texture_data_compressed + 0x40);
      (**(code **)(lVar3 + 0x288))(0x8518,0,0x9274,8,8,0,0x20,s_texture_data_compressed + 0x60);
      (**(code **)(lVar3 + 0x288))(0x8519,0,0x9274,8,8,0,0x20,s_texture_data_compressed + 0x80);
      (**(code **)(lVar3 + 0x288))(0x851a,0,0x9274,8,8,0,0x20,s_texture_data_compressed + 0xa0);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      msg = "glCompressedTexImage2D call failed.";
      iVar1 = 0x37d;
    }
    else if (target == 0x8c1a) {
      (**(code **)(lVar3 + 0x290))
                (0x8c1a,0,0x9274,8,8,8,(ulong)uVar5 << 0x20,0x100,s_texture_data_compressed);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      msg = "glCompressedTexImage3D call failed.";
      iVar1 = 0x388;
    }
    else {
      if (target != 0xde1) {
LAB_00979346:
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      (**(code **)(lVar3 + 0x288))(0xde1,0,0x9274,8,8,0,0x20,s_texture_data_compressed);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      msg = "glCompressedTexImage2D call failed.";
      iVar1 = 0x362;
    }
    goto LAB_00979339;
  }
  if (target == 0x9009) {
    (**(code **)(lVar3 + 0x1320))(0x9009,0,0x8058,8,8,6,(ulong)uVar5 << 0x20,0x1908,0x1401,"");
    dVar2 = (**(code **)(lVar3 + 0x800))();
    msg = "glTexImage3D call failed.";
    iVar1 = 0x3b6;
    goto LAB_00979339;
  }
  if (target != 0xde1) {
    if (target == 0x806f) {
LAB_00978f80:
      (**(code **)(lVar3 + 0x1320))(target,0,0x8058,8,8,8,(ulong)uVar5 << 0x20,0x1908,0x1401,"");
      dVar2 = (**(code **)(lVar3 + 0x800))();
      msg = "glTexImage3D call failed.";
      iVar1 = 0x3bc;
      goto LAB_00979339;
    }
    if (target != 0x84f5) {
      if (target == 0x8513) {
        (**(code **)(lVar3 + 0x1310))(0x8515,0,0x8058,8,8,0,0x1908,0x1401,"");
        (**(code **)(lVar3 + 0x1310))(0x8516,0,0x8058,8,8,0,0x1908,0x1401," ");
        (**(code **)(lVar3 + 0x1310))(0x8517,0,0x8058,8,8,0,0x1908,0x1401,"@");
        (**(code **)(lVar3 + 0x1310))(0x8518,0,0x8058,8,8,0,0x1908,0x1401,"`");
        (**(code **)(lVar3 + 0x1310))(0x8519,0,0x8058,8,8,0,0x1908,0x1401,(GLubyte *)0x1664df0);
        (**(code **)(lVar3 + 0x1310))(0x851a,0,0x8058,8,8,0,0x1908,0x1401,(GLubyte *)0x1664ef0);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        msg = "glTexImage2D call failed.";
        iVar1 = 0x3b1;
        goto LAB_00979339;
      }
      if (target != 0x8c18) {
        if (target != 0x8c1a) {
          if (target != 0xde0) goto LAB_00979346;
          (**(code **)(lVar3 + 0x1308))(0xde0,0,0x8058,8,0,0x1908,0x1401,"");
          dVar2 = (**(code **)(lVar3 + 0x800))();
          msg = "glTexImage1D call failed.";
          iVar1 = 0x395;
          goto LAB_00979339;
        }
        goto LAB_00978f80;
      }
    }
  }
  (**(code **)(lVar3 + 0x1310))(target,0,0x8058,8,8,0,0x1908,0x1401,"");
  dVar2 = (**(code **)(lVar3 + 0x800))();
  msg = "glTexImage2D call failed.";
  iVar1 = 0x39c;
LAB_00979339:
  glu::checkError(dVar2,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                  ,iVar1);
  return;
}

Assistant:

void gl4cts::GetTextureSubImage::Functional::prepare(glw::GLenum target, bool is_compressed)
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate and bind texture. */
	gl.genTextures(1, &m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures call failed.");

	gl.bindTexture(target, m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	/* Upload data to the texture. */
	if (is_compressed)
	{
		/* Upload compressed texture. */
		switch (target)
		{
		case GL_TEXTURE_2D:
			gl.compressedTexImage2D(target, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height, 0,
									s_texture_data_compressed_size / s_texture_data_depth, s_texture_data_compressed);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage2D call failed.");
			break;
		case GL_TEXTURE_CUBE_MAP:
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[0 * s_texture_data_compressed_size / s_texture_data_depth]);
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[1 * s_texture_data_compressed_size / s_texture_data_depth]);
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[2 * s_texture_data_compressed_size / s_texture_data_depth]);
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[3 * s_texture_data_compressed_size / s_texture_data_depth]);
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[4 * s_texture_data_compressed_size / s_texture_data_depth]);
			gl.compressedTexImage2D(
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
				0, s_texture_data_compressed_size / s_texture_data_depth,
				&s_texture_data_compressed[5 * s_texture_data_compressed_size / s_texture_data_depth]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage2D call failed.");
			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:
			gl.compressedTexImage3D(target, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height, 6,
									0, s_texture_data_compressed_size / s_texture_data_depth * 6,
									s_texture_data_compressed);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage3D call failed.");
			break;
		case GL_TEXTURE_2D_ARRAY:
			gl.compressedTexImage3D(target, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_width, s_texture_data_height,
									s_texture_data_depth, 0, s_texture_data_compressed_size, s_texture_data_compressed);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage3D call failed.");
			break;
		default:
			throw 0;
		};
	}
	else
	{
		/* Upload uncompressed texture. */
		switch (target)
		{
		case GL_TEXTURE_1D:
			gl.texImage1D(target, 0, GL_RGBA8, s_texture_data_width, 0, GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");
			break;
		case GL_TEXTURE_1D_ARRAY:
		case GL_TEXTURE_2D:
		case GL_TEXTURE_RECTANGLE:
			gl.texImage2D(target, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0, GL_RGBA,
						  GL_UNSIGNED_BYTE, s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D call failed.");
			break;
		case GL_TEXTURE_CUBE_MAP:
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[0 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[1 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[2 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[3 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[4 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE,
						  &s_texture_data[5 * s_texture_data_width * s_texture_data_height * 4 /* RGBA */]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D call failed.");
			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:
			gl.texImage3D(target, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 6, 0, GL_RGBA,
						  GL_UNSIGNED_BYTE, s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D call failed.");
			break;
		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
			gl.texImage3D(target, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, s_texture_data_depth, 0,
						  GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D call failed.");
			break;
		default:
			throw 0;
		};
	}
}